

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O3

void bmcg_sat_solver_print_sop_lit(Gia_Man_t *p,int Lit)

{
  int iVar1;
  Vec_Int_t *vSupp;
  int *piVar2;
  Gia_Man_t *p_00;
  long lVar3;
  int iNode;
  uint local_2c;
  
  vSupp = (Vec_Int_t *)malloc(0x10);
  vSupp->nCap = 100;
  vSupp->nSize = 0;
  piVar2 = (int *)malloc(400);
  vSupp->pArray = piVar2;
  if (Lit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  local_2c = (uint)Lit >> 1;
  Gia_ManCollectCis(p,(int *)&local_2c,1,vSupp);
  qsort(vSupp->pArray,(long)vSupp->nSize,4,Vec_IntSortCompare1);
  if (0 < vSupp->nSize) {
    piVar2 = vSupp->pArray;
    lVar3 = 0;
    do {
      iVar1 = piVar2[lVar3];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (-1 < (int)*(undefined8 *)(p->pObjs + iVar1)) {
        __assert_fail("pObj->fTerm",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
      }
      piVar2[lVar3] = (uint)((ulong)*(undefined8 *)(p->pObjs + iVar1) >> 0x20) & 0x1fffffff;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vSupp->nSize);
  }
  printf("Vector has %d entries: {");
  if (0 < vSupp->nSize) {
    lVar3 = 0;
    do {
      printf(" %d",(ulong)(uint)vSupp->pArray[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < vSupp->nSize);
  }
  puts(" }");
  p_00 = Gia_ManDupConeSupp(p,Lit,vSupp);
  if (vSupp->pArray != (int *)0x0) {
    free(vSupp->pArray);
  }
  free(vSupp);
  bmcg_sat_solver_print_sop(p_00);
  Gia_ManStop(p_00);
  putchar(10);
  return;
}

Assistant:

void bmcg_sat_solver_print_sop_lit( Gia_Man_t * p, int Lit )
{
    Vec_Int_t * vCisUsed = Vec_IntAlloc( 100 );
    int i, ObjId, iNode = Abc_Lit2Var( Lit );
    Gia_ManCollectCis( p, &iNode, 1, vCisUsed );
    Vec_IntSort( vCisUsed, 0 );
    Vec_IntForEachEntry( vCisUsed, ObjId, i )
        Vec_IntWriteEntry( vCisUsed, i, Gia_ManIdToCioId(p, ObjId) );
    Vec_IntPrint( vCisUsed );
    Gia_Man_t * pNew = Gia_ManDupConeSupp( p, Lit, vCisUsed );
    Vec_IntFree( vCisUsed );
    bmcg_sat_solver_print_sop( pNew );
    Gia_ManStop( pNew );
    printf( "\n" );
}